

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O1

void __thiscall URI::clear(URI *this)

{
  (this->scheme)._M_string_length = 0;
  this->allocatedMemory = 0;
  this->deallocatedMemory = 0;
  *(this->scheme)._M_dataplus._M_p = '\0';
  (this->userinfo)._M_string_length = 0;
  *(this->userinfo)._M_dataplus._M_p = '\0';
  (this->host)._M_string_length = 0;
  *(this->host)._M_dataplus._M_p = '\0';
  this->port = 0;
  (this->portStr)._M_string_length = 0;
  *(this->portStr)._M_dataplus._M_p = '\0';
  (this->path)._M_string_length = 0;
  *(this->path)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->pathSegments,
                    (this->pathSegments).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->query)._M_string_length = 0;
  *(this->query)._M_dataplus._M_p = '\0';
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->queryNullItems)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->queryStrItems)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::clear(&(this->queryIntItems)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::clear(&(this->queryDoubleItems)._M_t);
  (this->fragment)._M_string_length = 0;
  *(this->fragment)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void clear()
    {
        allocatedMemory = 0;
        deallocatedMemory = 0;
        scheme.clear();
        userinfo.clear();
        host.clear();
        port = 0;
        portStr.clear();
        path.clear();
        pathSegments.clear();
        query.clear();
        queryNullItems.clear();
        queryStrItems.clear();
        queryIntItems.clear();
        queryDoubleItems.clear();
        fragment.clear();
    }